

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O3

VmConstant * LoadFrameInt(InstructionVMEvalContext *ctx,Storage *storage,uint offset,VmType type)

{
  int value;
  bool bVar1;
  VmConstant *pVVar2;
  
  bVar1 = InstructionVMEvalContext::Storage::Reserve(storage,ctx,offset,4);
  if (!bVar1) {
    anon_unknown.dwarf_14fabe::Report(ctx,"ERROR: out of stack space");
    return (VmConstant *)0x0;
  }
  value = *(int *)((storage->data).data + offset);
  if (type.type == VM_TYPE_POINTER) {
    pVVar2 = CreateConstantPointer
                       (ctx->allocator,(SynBase *)0x0,value,(VariableData *)0x0,type.structType,
                        false);
    return pVVar2;
  }
  pVVar2 = CreateConstantInt(ctx->allocator,(SynBase *)0x0,value);
  return pVVar2;
}

Assistant:

VmConstant* LoadFrameInt(InstructionVMEvalContext &ctx, InstructionVMEvalContext::Storage *storage, unsigned offset, VmType type)
{
	int value = 0;
	if(!storage->Reserve(ctx, offset, sizeof(value)))
		return (VmConstant*)Report(ctx, "ERROR: out of stack space");

	memcpy(&value, storage->data.data + offset, sizeof(value));

	if(type.type == VM_TYPE_POINTER)
		return CreateConstantPointer(ctx.allocator, NULL, value, NULL, type.structType, false);

	return CreateConstantInt(ctx.allocator, NULL, value);
}